

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

void Curl_bufq_skip(bufq *q,size_t amount)

{
  size_t sVar1;
  bool bVar2;
  size_t n;
  size_t amount_local;
  bufq *q_local;
  
  n = amount;
  while( true ) {
    bVar2 = false;
    if (n != 0) {
      bVar2 = q->head != (buf_chunk *)0x0;
    }
    if (!bVar2) break;
    sVar1 = chunk_skip(q->head,n);
    n = n - sVar1;
    prune_head(q);
  }
  return;
}

Assistant:

void Curl_bufq_skip(struct bufq *q, size_t amount)
{
  size_t n;

  while(amount && q->head) {
    n = chunk_skip(q->head, amount);
    amount -= n;
    prune_head(q);
  }
}